

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (handle == &client || handle == &server) {
    if (flags == 0) {
      if (nread < 0) {
        pcVar1 = "0 && \"unexpected error\"";
        uStack_10 = 0x47;
      }
      else if (nread == 0) {
        if (addr == (sockaddr *)0x0) {
          return;
        }
        pcVar1 = "addr == NULL";
        uStack_10 = 0x4c;
      }
      else if (addr == (sockaddr *)0x0) {
        pcVar1 = "addr != NULL";
        uStack_10 = 0x50;
      }
      else if (nread == 4) {
        if (*(int *)buf->base == 0x474e4f50) {
          cl_recv_cb_called = cl_recv_cb_called + 1;
          uv_close((uv_handle_t *)handle,close_cb);
          return;
        }
        pcVar1 = "!memcmp(\"PONG\", buf->base, nread)";
        uStack_10 = 0x52;
      }
      else {
        pcVar1 = "nread == 4";
        uStack_10 = 0x51;
      }
    }
    else {
      pcVar1 = "flags == 0";
      uStack_10 = 0x44;
    }
  }
  else {
    pcVar1 = "(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client";
    uStack_10 = 0x43;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-and-recv.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT(flags == 0);
  ASSERT(nread == UV_ENOBUFS);

  cl_recv_cb_called++;

  uv_close((uv_handle_t*) handle, close_cb);
}